

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwpq_vdpp_proc.cpp
# Opt level: O0

int hwpq_vdpp_check_work_mode(rk_vdpp_context ctx,rk_vdpp_proc_params *p_proc_param)

{
  vdpp_com_ctx *vdpp_00;
  MPP_RET MVar1;
  int local_3c;
  MPP_RET ret;
  int run_mode;
  vdpp_com_ctx *vdpp;
  VdppCtxImpl *p;
  RK_S32 cap_mode;
  rk_vdpp_proc_params *p_proc_param_local;
  rk_vdpp_context ctx_local;
  
  p._4_4_ = 0;
  local_3c = -1;
  if ((ctx == (rk_vdpp_context)0x0) || (p_proc_param == (rk_vdpp_proc_params *)0x0)) {
    _mpp_log_l(2,(char *)0x0,"found NULL vdpp %p proc_param %p","hwpq_vdpp_check_work_mode",ctx,
               p_proc_param);
    ctx_local._4_4_ = -1;
  }
  else {
    vdpp_00 = *ctx;
    if ((vdpp_00 == (vdpp_com_ctx *)0x0) || (vdpp_00->ops == (vdpp_com_ops *)0x0)) {
      _mpp_log_l(2,(char *)0x0,"found NULL vdpp or ops","hwpq_vdpp_check_work_mode");
      ctx_local._4_4_ = -1;
    }
    else {
      MVar1 = hwpq_vdpp_common_config(vdpp_00,p_proc_param);
      if (MVar1 == MPP_OK) {
        if (vdpp_00->ops->check_cap != (_func_RK_S32_VdppCtx *)0x0) {
          p._4_4_ = (*vdpp_00->ops->check_cap)(vdpp_00->priv);
        }
        if ((hwpq_vdpp_debug & 2) != 0) {
          _mpp_log_l(4,(char *)0x0,"vdpp cap_mode %d",(char *)0x0,(ulong)p._4_4_);
        }
        if ((p._4_4_ & 1) == 0) {
          if ((p._4_4_ & 2) != 0) {
            local_3c = 1;
          }
        }
        else {
          local_3c = 0;
        }
        ctx_local._4_4_ = local_3c;
      }
      else {
        _mpp_log_l(2,(char *)0x0,"vdpp common config failed\n",(char *)0x0);
        ctx_local._4_4_ = -1;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int hwpq_vdpp_check_work_mode(rk_vdpp_context ctx, rk_vdpp_proc_params *p_proc_param)
{
    RK_S32 cap_mode = VDPP_CAP_UNSUPPORTED;
    VdppCtxImpl *p = (VdppCtxImpl*)ctx;
    vdpp_com_ctx* vdpp = NULL;
    int run_mode = VDPP_RUN_MODE_UNSUPPORTED;
    MPP_RET ret = MPP_NOK;

    if (NULL == ctx || NULL == p_proc_param) {
        mpp_err_f("found NULL vdpp %p proc_param %p", ctx, p_proc_param);
        return VDPP_RUN_MODE_UNSUPPORTED;
    }

    vdpp = p->vdpp;
    if (NULL == vdpp || NULL == vdpp->ops) {
        mpp_err_f("found NULL vdpp or ops");
        return VDPP_RUN_MODE_UNSUPPORTED;
    }

    ret = hwpq_vdpp_common_config(vdpp, p_proc_param);
    if (ret) {
        mpp_err("vdpp common config failed\n");
        return VDPP_RUN_MODE_UNSUPPORTED;
    }

    if (vdpp->ops->check_cap)
        cap_mode = vdpp->ops->check_cap(vdpp->priv);

    hwpq_vdpp_info("vdpp cap_mode %d", cap_mode);
    /* vep first */
    if (VDPP_CAP_VEP & cap_mode)
        run_mode = VDPP_RUN_MODE_VEP;
    else if (VDPP_CAP_HIST & cap_mode)
        run_mode = VDPP_RUN_MODE_HIST;

    return run_mode;
}